

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_unit.cc
# Opt level: O1

string * __thiscall
pstack::Dwarf::Unit::strx_abi_cxx11_(string *__return_storage_ptr__,Unit *this,size_t idx)

{
  size_t len;
  string *psVar1;
  intmax_t iVar2;
  uintmax_t uVar3;
  Exception *this_00;
  undefined1 local_210 [8];
  DWARFReader r;
  undefined1 local_70 [56];
  string *local_38;
  
  if ((this->dwarf->debugStrOffsets->shdr).sh_type != 0) {
    root((DIE *)local_70,this);
    DIE::attribute((Attribute *)local_210,(DIE *)local_70,DW_AT_str_offsets_base,false);
    local_38 = __return_storage_ptr__;
    iVar2 = DIE::Attribute::operator_cast_to_long((Attribute *)local_210);
    DIE::~DIE((DIE *)local_210);
    DIE::~DIE((DIE *)local_70);
    len = this->dwarfLen;
    Elf::Section::io((Section *)(local_70 + 0x28));
    local_210 = (undefined1  [8])(idx * len + iVar2);
    r.off = (**(code **)(*(long *)local_70._40_8_ + 0x40))();
    r.end = local_70._40_8_;
    r.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_70._48_8_;
    local_70._40_8_ = 0;
    local_70._48_8_ = 0;
    r.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _0_4_ = 8;
    Elf::Section::io((Section *)local_70);
    psVar1 = local_38;
    uVar3 = DWARFReader::getuint((DWARFReader *)local_210,len);
    (*(*(_func_int ***)local_70._0_8_)[7])(psVar1,local_70._0_8_,uVar3);
    if ((element_type *)local_70._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
    }
    if (r.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 r.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    return psVar1;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x1a0);
  memset((Exception *)local_210,0,0x1a0);
  Exception::Exception((Exception *)local_210);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&r,"no string offsets table, but have strx form",0x2b);
  Exception::Exception(this_00,(Exception *)local_210);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

std::string
Unit::strx(size_t idx) {
    if (!dwarf->debugStrOffsets)
        throw Exception() << "no string offsets table, but have strx form";
    // Get the root die, and the string offset base.
    auto base = intmax_t(root().attribute(DW_AT_str_offsets_base));
    auto len = dwarfLen;
    DWARFReader r(dwarf->debugStrOffsets.io(), base + len * idx);
    return dwarf->debugStrings.io()->readString(r.getuint(len));
}